

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

result_type * __thiscall
anon_unknown.dwarf_2c9a745::ByTxHashViewExtractor::operator()
          (result_type *__return_storage_ptr__,ByTxHashViewExtractor *this,Announcement *ann)

{
  long lVar1;
  Priority PVar2;
  byte bVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = (byte)((ulong)*(undefined8 *)&ann->field_0x30 >> 0x38);
  if ((uint)((ulong)*(undefined8 *)&ann->field_0x30 >> 0x3d) == 1) {
    PVar2 = PriorityComputer::operator()(this->m_computer,ann);
    bVar3 = (byte)((ulong)*(undefined8 *)&ann->field_0x30 >> 0x38);
  }
  else {
    PVar2 = 0;
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>).
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
       PVar2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>).
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = bVar3 >> 5;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>).
  super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = &ann->m_txhash;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

result_type operator()(const Announcement& ann) const
    {
        const Priority prio = (ann.GetState() == State::CANDIDATE_READY) ? m_computer(ann) : 0;
        return ByTxHashView{ann.m_txhash, ann.GetState(), prio};
    }